

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void calc_inventory(player *p)

{
  ushort uVar1;
  wchar_t wVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint uVar7;
  void *p_00;
  void *p_01;
  void *p_02;
  object *poVar8;
  uint local_84;
  wchar_t local_7c;
  object *poStack_78;
  wchar_t jfirst_1;
  object *first_1;
  object *poStack_68;
  wchar_t jfirst;
  object *first;
  object *poStack_58;
  wchar_t nsplit;
  object *to_quiver;
  wchar_t mult;
  wchar_t prefslot;
  wchar_t j;
  wchar_t i;
  object *current;
  _Bool *assigned;
  object **old_pack;
  object **old_quiver;
  wchar_t n_max;
  wchar_t n_pack_remaining;
  wchar_t n_stack_split;
  wchar_t old_inven_cnt;
  player *p_local;
  
  wVar2 = p->upkeep->inven_cnt;
  n_max = L'\0';
  uVar1 = z_info->pack_size;
  wVar4 = pack_slots_used(p);
  wVar4 = (uint)uVar1 - wVar4;
  wVar5 = z_info->pack_size + 1 + (uint)z_info->quiver_size + (uint)(p->body).count;
  p_00 = mem_zalloc((ulong)z_info->quiver_size << 3);
  p_01 = mem_zalloc((ulong)z_info->pack_size << 3);
  p_02 = mem_alloc((long)wVar5);
  _j = p->gear;
  mult = L'\0';
  for (; _j != (object *)0x0; _j = _j->next) {
    if (wVar5 <= mult) {
      __assert_fail("j < n_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                    ,0x46f,"void calc_inventory(struct player *)");
    }
    _Var3 = object_is_equipped(p->body,_j);
    *(_Bool *)((long)p_02 + (long)mult) = _Var3;
    mult = mult + L'\x01';
  }
  for (; mult < wVar5; mult = mult + L'\x01') {
    *(undefined1 *)((long)p_02 + (long)mult) = 0;
  }
  p->upkeep->quiver_cnt = L'\0';
  for (prefslot = L'\0'; prefslot < (int)(uint)z_info->quiver_size; prefslot = prefslot + L'\x01') {
    if (p->upkeep->quiver[prefslot] == (object *)0x0) {
      *(undefined8 *)((long)p_00 + (long)prefslot * 8) = 0;
    }
    else {
      *(object **)((long)p_00 + (long)prefslot * 8) = p->upkeep->quiver[prefslot];
      p->upkeep->quiver[prefslot] = (object *)0x0;
    }
  }
  _j = p->gear;
  mult = L'\0';
  for (; _j != (object *)0x0; _j = _j->next) {
    if (((((*(byte *)((long)p_02 + (long)mult) & 1) == 0) &&
         (wVar6 = preferred_quiver_slot(_j), L'\xffffffff' < wVar6)) &&
        (wVar6 < (int)(uint)z_info->quiver_size)) && (p->upkeep->quiver[wVar6] == (object *)0x0)) {
      _Var3 = tval_is_ammo(_j);
      if (_Var3) {
        local_84 = 1;
      }
      else {
        local_84 = (uint)z_info->thrown_quiver_mult;
      }
      if ((uint)z_info->quiver_slot_size < _j->number * local_84) {
        uVar7 = (uint)((ulong)z_info->quiver_slot_size / (ulong)(long)(int)local_84);
        if (_j->number <= uVar7) {
          __assert_fail("nsplit < current->number",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x49c,"void calc_inventory(struct player *)");
        }
        if ((uVar7 == 0) || (wVar4 < n_max)) {
          poStack_58 = (object *)0x0;
        }
        else {
          poStack_58 = _j;
          poVar8 = object_split(_j,_j->number - uVar7);
          gear_insert_end(p,poVar8);
          n_max = n_max + L'\x01';
        }
      }
      else {
        poStack_58 = _j;
      }
      if (poStack_58 != (object *)0x0) {
        p->upkeep->quiver[wVar6] = poStack_58;
        p->upkeep->quiver_cnt = poStack_58->number * local_84 + p->upkeep->quiver_cnt;
        *(undefined1 *)((long)p_02 + (long)mult) = 1;
      }
    }
    mult = mult + L'\x01';
  }
  for (prefslot = L'\0'; prefslot < (int)(uint)z_info->quiver_size; prefslot = prefslot + L'\x01') {
    poStack_68 = (object *)0x0;
    first_1._4_4_ = L'\xffffffff';
    if (p->upkeep->quiver[prefslot] == (object *)0x0) {
      mult = L'\0';
      for (_j = p->gear; _j != (object *)0x0; _j = _j->next) {
        if (wVar5 <= mult) {
          __assert_fail("j < n_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x4c8,"void calc_inventory(struct player *)");
        }
        if (((((*(byte *)((long)p_02 + (long)mult) & 1) == 0) && (_Var3 = tval_is_ammo(_j), _Var3))
            && (((ushort)_j->number <= z_info->quiver_slot_size ||
                ((z_info->quiver_slot_size != 0 && (n_max <= wVar4)))))) &&
           (_Var3 = earlier_object(poStack_68,_j,false), _Var3)) {
          poStack_68 = _j;
          first_1._4_4_ = mult;
        }
        mult = mult + L'\x01';
      }
      if (poStack_68 == (object *)0x0) break;
      if (z_info->quiver_slot_size < (ushort)poStack_68->number) {
        if ((z_info->quiver_slot_size == 0) || (wVar4 < n_max)) {
          __assert_fail("z_info->quiver_slot_size > 0 && n_stack_split <= n_pack_remaining",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x4e6,"void calc_inventory(struct player *)");
        }
        poVar8 = object_split(poStack_68,(uint)poStack_68->number - (uint)z_info->quiver_slot_size);
        gear_insert_end(p,poVar8);
      }
      p->upkeep->quiver[prefslot] = poStack_68;
      p->upkeep->quiver_cnt = (uint)poStack_68->number + p->upkeep->quiver_cnt;
      *(undefined1 *)((long)p_02 + (long)first_1._4_4_) = 1;
    }
  }
  if ((character_dungeon & 1U) != 0) {
    for (prefslot = L'\0'; prefslot < (int)(uint)z_info->quiver_size; prefslot = prefslot + L'\x01')
    {
      if ((*(long *)((long)p_00 + (long)prefslot * 8) != 0) &&
         (p->upkeep->quiver[prefslot] != *(object **)((long)p_00 + (long)prefslot * 8))) {
        msg("You re-arrange your quiver.");
        break;
      }
    }
  }
  for (prefslot = L'\0'; prefslot < (int)(uint)z_info->pack_size; prefslot = prefslot + L'\x01') {
    *(object **)((long)p_01 + (long)prefslot * 8) = p->upkeep->inven[prefslot];
  }
  p->upkeep->inven_cnt = L'\0';
  for (prefslot = L'\0'; prefslot <= (int)(uint)z_info->pack_size; prefslot = prefslot + L'\x01') {
    poStack_78 = (object *)0x0;
    local_7c = L'\xffffffff';
    mult = L'\0';
    for (_j = p->gear; _j != (object *)0x0; _j = _j->next) {
      if (wVar5 <= mult) {
        __assert_fail("j < n_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                      ,0x50d,"void calc_inventory(struct player *)");
      }
      if (((*(byte *)((long)p_02 + (long)mult) & 1) == 0) &&
         (_Var3 = earlier_object(poStack_78,_j,false), _Var3)) {
        poStack_78 = _j;
        local_7c = mult;
      }
      mult = mult + L'\x01';
    }
    p->upkeep->inven[prefslot] = poStack_78;
    if (poStack_78 != (object *)0x0) {
      p->upkeep->inven_cnt = p->upkeep->inven_cnt + L'\x01';
      *(undefined1 *)((long)p_02 + (long)local_7c) = 1;
    }
  }
  if (((character_dungeon & 1U) != 0) && (p->upkeep->inven_cnt == wVar2)) {
    for (prefslot = L'\0'; prefslot < (int)(uint)z_info->pack_size; prefslot = prefslot + L'\x01') {
      if (((*(long *)((long)p_01 + (long)prefslot * 8) != 0) &&
          (p->upkeep->inven[prefslot] != *(object **)((long)p_01 + (long)prefslot * 8))) &&
         (_Var3 = object_is_equipped(p->body,*(object **)((long)p_01 + (long)prefslot * 8)), !_Var3)
         ) {
        msg("You re-arrange your pack.");
        break;
      }
    }
  }
  mem_free(p_02);
  mem_free(p_01);
  mem_free(p_00);
  return;
}

Assistant:

void calc_inventory(struct player *p)
{
	int old_inven_cnt = p->upkeep->inven_cnt;
	int n_stack_split = 0;
	int n_pack_remaining = z_info->pack_size - pack_slots_used(p);
	int n_max = 1 + z_info->pack_size + z_info->quiver_size
		+ p->body.count;
	struct object **old_quiver = mem_zalloc(z_info->quiver_size
		* sizeof(*old_quiver));
	struct object **old_pack = mem_zalloc(z_info->pack_size
		* sizeof(*old_pack));
	bool *assigned = mem_alloc(n_max * sizeof(*assigned));
	struct object *current;
	int i, j;

	/*
	 * Equipped items are already taken care of.  Only the others need
	 * to be tested for assignment to the quiver or pack.
	 */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		assert(j < n_max);
		assigned[j] = object_is_equipped(p->body, current);
	}
	for (; j < n_max; ++j) {
		assigned[j] = false;
	}

	/* Prepare to fill the quiver */
	p->upkeep->quiver_cnt = 0;

	/* Copy the current quiver and then leave it empty. */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i]) {
			old_quiver[i] = p->upkeep->quiver[i];
			p->upkeep->quiver[i] = NULL;
		} else {
			old_quiver[i] = NULL;
		}
	}

	/* Fill quiver.  First, allocate inscribed items. */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		int prefslot;

		/* Skip already assigned (i.e. equipped) items. */
		if (assigned[j]) continue;

		prefslot  = preferred_quiver_slot(current);
		if (prefslot >= 0 && prefslot < z_info->quiver_size
				&& !p->upkeep->quiver[prefslot]) {
			/*
			 * The preferred slot is empty.  Split the stack if
			 * necessary.  Don't allow splitting if it could
			 * result in overfilling the pack by more than one slot.
			 */
			int mult = tval_is_ammo(current) ?
				1 : z_info->thrown_quiver_mult;
			struct object *to_quiver;

			if (current->number * mult
					<= z_info->quiver_slot_size) {
				to_quiver = current;
			} else {
				int nsplit = z_info->quiver_slot_size / mult;

				assert(nsplit < current->number);
				if (nsplit > 0 && n_stack_split
						<= n_pack_remaining) {
					/*
					 * Split off the portion that goes to
					 * the pack.  Since the stack in the
					 * quiver is earlier in the gear list it
					 * will prefer to remain in the quiver
					 * in future calls to calc_inventory()
					 * and will be the preferred target for
					 * combine_pack().
					 */
					to_quiver = current;
					gear_insert_end(p, object_split(current,
						current->number - nsplit));
					++n_stack_split;
				} else {
					to_quiver = NULL;
				}
			}

			if (to_quiver) {
				p->upkeep->quiver[prefslot] = to_quiver;
				p->upkeep->quiver_cnt += to_quiver->number * mult;

				/* That part of the gear has been dealt with. */
				assigned[j] = true;
			}
		}
	}

	/* Now fill the rest of the slots in order. */
	for (i = 0; i < z_info->quiver_size; ++i) {
		struct object *first = NULL;
		int jfirst = -1;

		/* If the slot is full, move on. */
		if (p->upkeep->quiver[i]) continue;

		/* Find the quiver object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/*
			 * Only try to assign if not assigned, ammo, and,
			 * if necessary to split, have room for the split
			 * stacks.
			 */
			if (!assigned[j] && tval_is_ammo(current)
					&& (current->number
					<= z_info->quiver_slot_size
					|| (z_info->quiver_slot_size > 0
					&& n_stack_split
					<= n_pack_remaining))) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Stop looking if there's nothing left in the gear. */
		if (!first) break;

		/* Put the item in the slot, splitting (if needed) to fit. */
		if (first->number > z_info->quiver_slot_size) {
			assert(z_info->quiver_slot_size > 0
				&& n_stack_split <= n_pack_remaining);
			/* As above, split off the portion going to the pack. */
			gear_insert_end(p, object_split(first,
				first->number - z_info->quiver_slot_size));
		}
		p->upkeep->quiver[i] = first;
		p->upkeep->quiver_cnt += first->number;

		/* That part of the gear has been dealt with. */
		assigned[jfirst] = true;
	}

	/* Note reordering */
	if (character_dungeon) {
		for (i = 0; i < z_info->quiver_size; i++) {
			if (old_quiver[i] && p->upkeep->quiver[i] != old_quiver[i]) {
				msg("You re-arrange your quiver.");
				break;
			}
		}
	}

	/* Copy the current pack */
	for (i = 0; i < z_info->pack_size; i++) {
		old_pack[i] = p->upkeep->inven[i];
	}

	/* Prepare to fill the inventory */
	p->upkeep->inven_cnt = 0;

	for (i = 0; i <= z_info->pack_size; i++) {
		struct object *first = NULL;
		int jfirst = -1;

		/* Find the object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/* Consider it if it hasn't already been handled. */
			if (!assigned[j]) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Allocate */
		p->upkeep->inven[i] = first;
		if (first) {
			++p->upkeep->inven_cnt;
			assigned[jfirst] = true;
		}
	}

	/* Note reordering */
	if (character_dungeon && p->upkeep->inven_cnt == old_inven_cnt) {
		for (i = 0; i < z_info->pack_size; i++) {
			if (old_pack[i] && p->upkeep->inven[i] != old_pack[i]
					 && !object_is_equipped(p->body, old_pack[i])) {
				msg("You re-arrange your pack.");
				break;
			}
		}
	}

	mem_free(assigned);
	mem_free(old_pack);
	mem_free(old_quiver);
}